

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O3

void __thiscall xs::ExecutionRequestHandler::processSession(ExecutionRequestHandler *this)

{
  MessageType type;
  pointer puVar1;
  bool bVar2;
  int iVar3;
  deUint64 dVar4;
  ssize_t sVar5;
  deUint64 dVar6;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  deUint8 *data;
  nfds_t __nfds;
  byte bVar7;
  ByteBuffer *in_RSI;
  int in_R8D;
  
  this->m_run = true;
  dVar4 = deGetMicroseconds();
  if (this->m_run == true) {
    do {
      bVar2 = receive(this);
      sVar5 = send(this,(int)in_RSI,__buf,in_RCX,in_R8D);
      if (0 < (this->m_bufferIn).m_numElements) {
        in_RSI = &this->m_bufferIn;
        MessageBuilder::read(&this->m_msgBuilder,(int)&this->m_bufferIn,__buf_00,in_RCX);
      }
      puVar1 = (this->m_msgBuilder).m_buffer.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      in_RCX = (long)(this->m_msgBuilder).m_buffer.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)puVar1;
      if ((7 < in_RCX) && (in_RCX == (this->m_msgBuilder).m_messageSize)) {
        type = (this->m_msgBuilder).m_messageType;
        in_RSI = (ByteBuffer *)(ulong)type;
        data = puVar1 + 8;
        if (in_RCX < 9) {
          data = (deUint8 *)0x0;
        }
        in_RCX = in_RCX - 8;
        processMessage(this,type,data,in_RCX);
        puVar1 = (this->m_msgBuilder).m_buffer.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->m_msgBuilder).m_buffer.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar1) {
          (this->m_msgBuilder).m_buffer.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar1;
        }
        (this->m_msgBuilder).m_messageType = MESSAGETYPE_NONE;
        (this->m_msgBuilder).m_messageSize = 0;
      }
      bVar7 = bVar2 | (byte)sVar5;
      pollKeepAlives(this);
      if (this->m_testDriver != (TestDriver *)0x0) {
        in_RSI = &this->m_bufferOut;
        iVar3 = TestDriver::poll(this->m_testDriver,(pollfd *)&this->m_bufferOut,__nfds,(int)in_RCX)
        ;
        bVar7 = bVar7 | (byte)iVar3;
      }
      dVar6 = deGetMicroseconds();
      if (bVar7 == 0) {
        if (dVar6 - dVar4 < 0x2711) {
          deYield();
          dVar6 = dVar4;
        }
        else {
          deSleep(0x32);
          dVar6 = dVar4;
        }
      }
      dVar4 = dVar6;
    } while (this->m_run != false);
  }
  return;
}

Assistant:

void ExecutionRequestHandler::processSession (void)
{
	m_run = true;

	deUint64 lastIoTime = deGetMicroseconds();

	while (m_run)
	{
		bool anyIO = false;

		// Read from socket to buffer.
		anyIO = receive() || anyIO;

		// Send bytes in buffer.
		anyIO = send() || anyIO;

		// Process incoming data.
		if (m_bufferIn.getNumElements() > 0)
		{
			DE_ASSERT(!m_msgBuilder.isComplete());
			m_msgBuilder.read(m_bufferIn);
		}

		if (m_msgBuilder.isComplete())
		{
			// Process message.
			processMessage(m_msgBuilder.getMessageType(), m_msgBuilder.getMessageData(), m_msgBuilder.getMessageDataSize());

			m_msgBuilder.clear();
		}

		// Keepalives, anyone?
		pollKeepAlives();

		// Poll test driver for IO.
		if (m_testDriver)
			anyIO = getTestDriver()->poll(m_bufferOut) || anyIO;

		// If no IO happens in a reasonable amount of time, go to sleep.
		{
			deUint64 curTime = deGetMicroseconds();
			if (anyIO)
				lastIoTime = curTime;
			else if (curTime-lastIoTime > SERVER_IDLE_THRESHOLD*1000)
				deSleep(SERVER_IDLE_SLEEP); // Too long since last IO, sleep for a while.
			else
				deYield(); // Just give other threads chance to run.
		}
	}
}